

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.cpp
# Opt level: O0

void rw::RawMatrix::transpose(RawMatrix *dst,RawMatrix *src)

{
  RawMatrix *src_local;
  RawMatrix *dst_local;
  
  (dst->right).x = (src->right).x;
  (dst->up).x = (src->right).y;
  (dst->at).x = (src->right).z;
  (dst->pos).x = src->rightw;
  (dst->right).y = (src->up).x;
  (dst->up).y = (src->up).y;
  (dst->at).y = (src->up).z;
  (dst->pos).y = src->upw;
  (dst->right).z = (src->at).x;
  (dst->up).z = (src->at).y;
  (dst->at).z = (src->at).z;
  (dst->pos).z = src->atw;
  dst->rightw = (src->pos).x;
  dst->upw = (src->pos).y;
  dst->atw = (src->pos).z;
  dst->posw = src->posw;
  return;
}

Assistant:

void
RawMatrix::transpose(RawMatrix *dst, RawMatrix *src)
{
	dst->right.x = src->right.x;
	dst->up.x = src->right.y;
	dst->at.x = src->right.z;
	dst->pos.x = src->rightw;
	dst->right.y = src->up.x;
	dst->up.y = src->up.y;
	dst->at.y = src->up.z;
	dst->pos.y = src->upw;
	dst->right.z = src->at.x;
	dst->up.z = src->at.y;
	dst->at.z = src->at.z;
	dst->pos.z = src->atw;
	dst->rightw = src->pos.x;
	dst->upw = src->pos.y;
	dst->atw = src->pos.z;
	dst->posw = src->posw;
}